

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_compress_image(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int *in_RDX;
  long in_RSI;
  char card [81];
  long *in_stack_000000b8;
  long ntrows;
  long trowsize;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long i0;
  long tilesize [6];
  long tile [6];
  long lpixel [6];
  long fpixel [6];
  long naxes [6];
  long incre [6];
  long tilelen;
  long maxtilelen;
  float fltnull;
  double dblnull;
  double dummy;
  int naxis;
  long row;
  long ii;
  int datatype;
  int gotnulls;
  int anynul;
  double *tiledata;
  long local_278;
  long local_270;
  long local_268;
  void *local_260;
  int *local_258;
  int *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  LONGLONG in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  fitsfile *in_stack_fffffffffffffe18;
  long local_1e0;
  char *local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long tilenx;
  long in_stack_fffffffffffffe58;
  void *in_stack_fffffffffffffe60;
  undefined4 local_198;
  int in_stack_fffffffffffffe6c;
  int *in_stack_fffffffffffffe70;
  fitsfile *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  fitsfile *in_stack_fffffffffffffe88;
  long local_170 [5];
  long local_148;
  int nullcheck;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  char *local_f0;
  long local_e8 [3];
  void *local_d0;
  int *local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  fitsfile *local_80;
  size_t local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  long local_50;
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  void *local_30;
  int *local_28;
  long local_20;
  int local_c;
  
  local_38 = 0;
  local_60 = 0;
  local_68 = 0xb8a83e285ebab4b7;
  local_6c = 0x8541f136;
  local_28 = in_RDX;
  local_20 = in_RSI;
  memset(&local_b8,0,0x30);
  local_b8 = 1;
  local_b0 = 1;
  local_a8 = 1;
  local_a0 = 1;
  local_98 = 1;
  local_90 = 1;
  if (*local_28 < 1) {
    local_78 = *(size_t *)(*(long *)(local_20 + 8) + 0x4c8);
    if (*(int *)(*(long *)(local_20 + 8) + 0x48c) == -0x20) {
      local_3c = 0x2a;
      if (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x29) {
        local_30 = malloc(local_78 << 3);
      }
      else {
        local_30 = malloc(local_78 << 2);
      }
    }
    else if (*(int *)(*(long *)(local_20 + 8) + 0x48c) == -0x40) {
      local_3c = 0x52;
      local_30 = malloc(local_78 << 3);
    }
    else if (*(int *)(*(long *)(local_20 + 8) + 0x48c) == 0x10) {
      local_3c = 0x15;
      if (((*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0xb) ||
          (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x15)) ||
         ((*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x16 ||
          ((*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x33 ||
           (*(int *)(*(long *)(local_20 + 8) + 0x43c) == -1)))))) {
        local_30 = malloc(local_78 << 1);
      }
      else {
        local_30 = malloc(local_78 << 2);
      }
    }
    else if (*(int *)(*(long *)(local_20 + 8) + 0x48c) == 8) {
      local_3c = 0xb;
      if ((((*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0xb) ||
           (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x33)) ||
          (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x15)) ||
         (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x16)) {
        local_30 = malloc(local_78);
      }
      else {
        local_30 = malloc(local_78 << 2);
      }
    }
    else {
      if (*(int *)(*(long *)(local_20 + 8) + 0x48c) != 0x20) {
        ffpmsg((char *)0x1e598e);
        *local_28 = 0x71;
        return 0x71;
      }
      local_3c = 0x1f;
      if (*(int *)(*(long *)(local_20 + 8) + 0x43c) == 0x29) {
        local_30 = malloc(local_78 << 3);
      }
      else {
        local_30 = malloc(local_78 << 2);
      }
    }
    if (local_30 == (void *)0x0) {
      ffpmsg((char *)0x1e59cb);
      *local_28 = 0x71;
      local_c = 0x71;
    }
    else {
      local_54 = *(int *)(*(long *)(local_20 + 8) + 0x490);
      for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
        if (local_48 < local_54) {
          local_e8[local_48] = *(long *)(*(long *)(local_20 + 8) + 0x498 + local_48 * 8);
          *(undefined8 *)(&stack0xfffffffffffffe58 + local_48 * 8) =
               *(undefined8 *)(*(long *)(local_20 + 8) + 0x440 + local_48 * 8);
        }
        else {
          local_e8[local_48] = 1;
          *(undefined8 *)(&stack0xfffffffffffffe58 + local_48 * 8) = 1;
        }
      }
      local_50 = 1;
      for (local_1d8 = (char *)0x1; (long)local_1d8 <= local_c0;
          local_1d8 = in_stack_fffffffffffffe80 + (long)local_1d8) {
        local_f0 = local_1d8;
        for (local_1d0 = 1; local_1d0 <= (long)local_c8;
            local_1d0 = (long)&in_stack_fffffffffffffe78->HDUposition + local_1d0) {
          local_f8 = local_1d0;
          if ((long)in_stack_fffffffffffffe78 + local_1d0 + -1 < (long)local_c8) {
            local_258 = (int *)((long)in_stack_fffffffffffffe78 + local_1d0 + -1);
          }
          else {
            local_258 = local_c8;
          }
          for (local_1c8 = 1; local_1c8 <= (long)local_d0;
              local_1c8 = (long)in_stack_fffffffffffffe70 + local_1c8) {
            local_100 = local_1c8;
            if ((long)in_stack_fffffffffffffe70 + local_1c8 + -1 < (long)local_d0) {
              local_260 = (void *)((long)in_stack_fffffffffffffe70 + local_1c8 + -1);
            }
            else {
              local_260 = local_d0;
            }
            for (local_1c0 = 1; local_1c0 <= local_e8[2];
                local_1c0 = CONCAT44(in_stack_fffffffffffffe6c,local_198) + local_1c0) {
              local_108 = local_1c0;
              if (local_1c0 + CONCAT44(in_stack_fffffffffffffe6c,local_198) + -1 < local_e8[2]) {
                local_268 = local_1c0 + CONCAT44(in_stack_fffffffffffffe6c,local_198) + -1;
              }
              else {
                local_268 = local_e8[2];
              }
              for (local_1b8 = 1; local_1b8 <= local_e8[1];
                  local_1b8 = (long)in_stack_fffffffffffffe60 + local_1b8) {
                local_110 = local_1b8;
                if ((long)in_stack_fffffffffffffe60 + local_1b8 + -1 < local_e8[1]) {
                  local_270 = (long)in_stack_fffffffffffffe60 + local_1b8 + -1;
                }
                else {
                  local_270 = local_e8[1];
                }
                for (tilenx = 1; tilenx <= local_e8[0]; tilenx = in_stack_fffffffffffffe58 + tilenx)
                {
                  local_118 = tilenx;
                  if (tilenx + in_stack_fffffffffffffe58 + -1 < local_e8[0]) {
                    local_278 = tilenx + in_stack_fffffffffffffe58 + -1;
                  }
                  else {
                    local_278 = local_e8[0];
                  }
                  local_148 = local_278;
                  in_stack_fffffffffffffe88 = (fitsfile *)((local_278 - tilenx) + 1);
                  local_80 = in_stack_fffffffffffffe88;
                  for (local_48 = 1; local_48 < local_54; local_48 = local_48 + 1) {
                    local_80 = (fitsfile *)(local_170[local_48 + -1] * (long)local_80);
                  }
                  local_34 = 0;
                  if (local_3c == 0x2a) {
                    ffgsve((fitsfile *)i5,trowsize._4_4_,(int)trowsize,(long *)ntrows,
                           in_stack_000000b8,stack0x000000b0,(long *)tilesize[0],(float)card._76_4_,
                           (float *)tilesize[1],(int *)tilesize[2],
                           (int *)CONCAT44(tilesize[3]._4_4_,
                                           CONCAT22(tilesize[3]._2_2_,
                                                    CONCAT11(tilesize[3]._1_1_,(uchar)tilesize[3])))
                          );
                  }
                  else if (local_3c == 0x52) {
                    ffgsvd((fitsfile *)i3,i4._4_4_,(int)i4,(long *)i5,
                           (long *)CONCAT44(trowsize._4_4_,(int)trowsize),(long *)ntrows,
                           (long *)tilesize[2],(double)in_stack_000000b8,
                           (double *)
                           CONCAT44(tilesize[3]._4_4_,
                                    CONCAT22(tilesize[3]._2_2_,
                                             CONCAT11(tilesize[3]._1_1_,(uchar)tilesize[3]))),
                           (int *)tilesize[4],(int *)tilesize[5]);
                  }
                  else if (local_3c == 0x1f) {
                    ffgsvk((fitsfile *)i3,i4._4_4_,(int)i4,(long *)i5,
                           (long *)CONCAT44(trowsize._4_4_,(int)trowsize),(long *)ntrows,
                           (long *)tilesize[2],
                           CONCAT22(tilesize[3]._2_2_,CONCAT11(tilesize[3]._1_1_,(uchar)tilesize[3])
                                   ),(int *)tilesize[4],(int *)tilesize[5],(int *)tile[0]);
                  }
                  else if (local_3c == 0x15) {
                    ffgsvi((fitsfile *)i3,i4._4_4_,(int)i4,(long *)i5,
                           (long *)CONCAT44(trowsize._4_4_,(int)trowsize),(long *)ntrows,
                           (long *)tilesize[2],CONCAT11(tilesize[3]._1_1_,(uchar)tilesize[3]),
                           (short *)tilesize[4],(int *)tilesize[5],(int *)tile[0]);
                  }
                  else {
                    if (local_3c != 0xb) {
                      ffpmsg((char *)0x1e618d);
                      free(local_30);
                      return *local_28;
                    }
                    ffgsvb((fitsfile *)i3,i4._4_4_,(int)i4,(long *)i5,
                           (long *)CONCAT44(trowsize._4_4_,(int)trowsize),(long *)ntrows,
                           (long *)tilesize[2],(uchar)tilesize[3],(uchar *)tilesize[4],
                           (int *)tilesize[5],(int *)tile[0]);
                  }
                  fits_calc_tile_rows(&local_148,&local_118,local_54,&local_1e0,
                                      (long *)&stack0xfffffffffffffe18,local_28);
                  nullcheck = (int)local_268;
                  if ((local_34 == 0) || (local_3c != 0x2a)) {
                    if ((local_34 == 0) || (local_3c != 0x52)) {
                      imcomp_compress_tile
                                (in_stack_fffffffffffffe78,(long)in_stack_fffffffffffffe70,
                                 in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                                 in_stack_fffffffffffffe58,tilenx,local_270,nullcheck,local_260,
                                 local_258);
                    }
                    else {
                      imcomp_compress_tile
                                (in_stack_fffffffffffffe78,(long)in_stack_fffffffffffffe70,
                                 in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                                 in_stack_fffffffffffffe58,tilenx,local_270,nullcheck,local_260,
                                 local_258);
                    }
                  }
                  else {
                    imcomp_compress_tile
                              (in_stack_fffffffffffffe78,(long)in_stack_fffffffffffffe70,
                               in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                               in_stack_fffffffffffffe58,tilenx,local_270,nullcheck,local_260,
                               local_258);
                  }
                  if (local_34 != 0) {
                    local_38 = 1;
                  }
                  if (0 < *local_28) {
                    ffpmsg((char *)0x1e6374);
                    free(local_30);
                    return *local_28;
                  }
                  local_50 = local_50 + 1;
                }
              }
            }
          }
        }
      }
      free(local_30);
      if (local_38 != 0) {
        ffgcrd(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78
               ,in_stack_fffffffffffffe70);
        ffikyj(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
      local_c = *local_28;
    }
  }
  else {
    local_c = *local_28;
  }
  return local_c;
}

Assistant:

int imcomp_compress_image (fitsfile *infptr, fitsfile *outfptr, int *status)

/* This routine does the following:
        - reads an image one tile at a time
        - if it is a float or double image, then it tries to quantize the pixels
          into scaled integers.
        - it then compressess the integer pixels, or if the it was not
	  possible to quantize the floating point pixels, then it losslessly
	  compresses them with gzip
	- writes the compressed byte stream to the output FITS file
*/
{
    double *tiledata;
    int anynul, gotnulls = 0, datatype;
    long ii, row;
    int naxis;
    double dummy = 0., dblnull = DOUBLENULLVALUE;
    float fltnull = FLOATNULLVALUE;
    long maxtilelen, tilelen, incre[] = {1, 1, 1, 1, 1, 1};
    long naxes[MAX_COMPRESS_DIM], fpixel[MAX_COMPRESS_DIM];
    long lpixel[MAX_COMPRESS_DIM], tile[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM];
    long i0, i1, i2, i3, i4, i5, trowsize, ntrows;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    maxtilelen = (outfptr->Fptr)->maxtilelen;

    /* 
     Allocate buffer to hold 1 tile of data; size depends on which compression 
     algorithm is used:

      Rice and GZIP will compress byte, short, or int arrays without conversion.
      PLIO requires 4-byte int values, so byte and short arrays must be converted to int.
      HCompress internally converts byte or short values to ints, and
         converts int values to 8-byte longlong integers.
    */
    
    if ((outfptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        datatype = TFLOAT;

        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */
            tiledata = (double*) malloc (maxtilelen * 2 *sizeof (float));	
	} else {
            tiledata = (double*) malloc (maxtilelen * sizeof (float));
	}
    }
    else if ((outfptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        datatype = TDOUBLE;
        tiledata = (double*) malloc (maxtilelen * sizeof (double));
    }
    else if ((outfptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
             (outfptr->Fptr)->compress_type == NOCOMPRESS) {
	    /* only need  buffer of I*2 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen * sizeof (short));	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == BYTE_IMG)
    {

        datatype = TBYTE;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2) {
	    /* only need  buffer of I*1 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen);	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */

            tiledata = (double*) malloc (maxtilelen * 2 * sizeof (int));	
	} else {
 	    /* only need  buffer of I*4 pixels for gzip, bzip2,  Rice, and PLIO */

            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else
    {
	ffpmsg("Bad image datatype. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }
    
    if (tiledata == NULL)
    {
	ffpmsg("Out of memory. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }

    /*  calculate size of tile in each dimension */
    naxis = (outfptr->Fptr)->zndim;
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        if (ii < naxis)
        {
             naxes[ii] = (outfptr->Fptr)->znaxis[ii];
             tilesize[ii] = (outfptr->Fptr)->tilesize[ii];
        }
        else
        {
            naxes[ii] = 1;
            tilesize[ii] = 1;
        }
    }
    row = 1;

    /* set up big loop over up to 6 dimensions */
    for (i5 = 1; i5 <= naxes[5]; i5 += tilesize[5])
    {
     fpixel[5] = i5;
     lpixel[5] = minvalue(i5 + tilesize[5] - 1, naxes[5]);
     tile[5] = lpixel[5] - fpixel[5] + 1;
     for (i4 = 1; i4 <= naxes[4]; i4 += tilesize[4])
     {
      fpixel[4] = i4;
      lpixel[4] = minvalue(i4 + tilesize[4] - 1, naxes[4]);
      tile[4] = lpixel[4] - fpixel[4] + 1;
      for (i3 = 1; i3 <= naxes[3]; i3 += tilesize[3])
      {
       fpixel[3] = i3;
       lpixel[3] = minvalue(i3 + tilesize[3] - 1, naxes[3]);
       tile[3] = lpixel[3] - fpixel[3] + 1;
       for (i2 = 1; i2 <= naxes[2]; i2 += tilesize[2])
       {
        fpixel[2] = i2;
        lpixel[2] = minvalue(i2 + tilesize[2] - 1, naxes[2]);
        tile[2] = lpixel[2] - fpixel[2] + 1;
        for (i1 = 1; i1 <= naxes[1]; i1 += tilesize[1])
        {
         fpixel[1] = i1;
         lpixel[1] = minvalue(i1 + tilesize[1] - 1, naxes[1]);
         tile[1] = lpixel[1] - fpixel[1] + 1;
         for (i0 = 1; i0 <= naxes[0]; i0 += tilesize[0])
         {
          fpixel[0] = i0;
          lpixel[0] = minvalue(i0 + tilesize[0] - 1, naxes[0]);
          tile[0] = lpixel[0] - fpixel[0] + 1;

          /* number of pixels in this tile */
          tilelen = tile[0];
          for (ii = 1; ii < naxis; ii++)
          {
             tilelen *= tile[ii];
          }

          /* read next tile of data from image */
	  anynul = 0;
          if (datatype == TFLOAT)
          {
              ffgsve(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  FLOATNULLVALUE, (float *) tiledata,  &anynul, status);
          }
          else if (datatype == TDOUBLE)
          {
              ffgsvd(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  DOUBLENULLVALUE, tiledata, &anynul, status);
          }
          else if (datatype == TINT)
          {
              ffgsvk(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (int *) tiledata,  &anynul, status);
          }
          else if (datatype == TSHORT)
          {
              ffgsvi(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (short *) tiledata,  &anynul, status);
          }
          else if (datatype == TBYTE)
          {
              ffgsvb(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (unsigned char *) tiledata,  &anynul, status);
          }
          else 
          {
              ffpmsg("Error bad datatype of image tile to compress");
              free(tiledata);
              return (*status);
          }

          /* now compress the tile, and write to row of binary table */
          /*   NOTE: we don't have to worry about the presence of null values in the
	       array if it is an integer array:  the null value is simply encoded
	       in the compressed array just like any other pixel value.  
	       
	       If it is a floating point array, then we need to check for null
	       only if the anynul parameter returned a true value when reading the tile
	  */
          
          /* Collapse sizes of higher dimension tiles into 2 dimensional
             equivalents needed by the quantizing algorithms for
             floating point types */
          fits_calc_tile_rows(lpixel, fpixel, naxis, &trowsize,
                            &ntrows, status);

          if (anynul && datatype == TFLOAT) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &fltnull, status);
          } else if (anynul && datatype == TDOUBLE) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &dblnull, status);
          } else {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 0, &dummy, status);
          }

          /* set flag if we found any null values */
          if (anynul)
              gotnulls = 1;

          /* check for any error in the previous operations */
          if (*status > 0)
          {
              ffpmsg("Error writing compressed image to table");
              free(tiledata);
              return (*status);
          }

	  row++;
         }
        }
       }
      }
     }
    }

    free (tiledata);  /* finished with this buffer */

    /* insert ZBLANK keyword if necessary; only for TFLOAT or TDOUBLE images */
    if (gotnulls)
    {
          ffgcrd(outfptr, "ZCMPTYPE", card, status);
          ffikyj(outfptr, "ZBLANK", COMPRESS_NULL_VALUE, 
             "null value in the compressed integer array", status);
    }

    return (*status);
}